

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csvparams_tests.cpp
# Opt level: O2

void CsvParamsIntTest::TearDownTestCase(void)

{
  Fixed *fixed;
  int *expected;
  int *in_R9;
  unsigned_long val;
  AssertionResult iutest_ar;
  iuCodeMessage local_1e8;
  Fixed local_1b8;
  
  expected = check_params;
  for (val = 0; val != 7; val = val + 1) {
    local_1b8.super_Message.m_stream.super_iu_stringstream._0_4_ = 0;
    iutest::internal::CmpHelperEQ<int,int>
              (&iutest_ar,(internal *)0x133296,"check_params[i]",(char *)&local_1b8,expected,in_R9);
    if (iutest_ar.m_result == false) {
      memset(&local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_1b8);
      fixed = iutest::AssertionHelper::Fixed::operator<<(&local_1b8,val);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/csvparams_tests.cpp"
                 ,0x2d,iutest_ar.m_message._M_dataplus._M_p);
      local_1e8._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,fixed);
      std::__cxx11::string::~string((string *)&local_1e8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_1b8);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    expected = expected + 1;
  }
  return;
}

Assistant:

static void TearDownTestCase(void)
    {
        for( size_t i=0; i < IUTEST_PP_COUNTOF(check_params); ++i )
        {
            IUTEST_EXPECT_EQ( 0, check_params[i] ) << i;
        }
    }